

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceTexelFetch_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType samplerDataType,DataType pDataType,DataType sampleDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  DataType dataType;
  uint uVar4;
  ostringstream source;
  undefined1 auStack_2b8 [12];
  DataType local_2ac;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  shaderType_00 = shaderType;
  local_2ac = pDataType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  __s = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_2b8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x110);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  getDataTypeExtension_abi_cxx11_(&local_1c8,(_anonymous_namespace_ *)(ulong)shaderType,dataType);
  NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_2a8,&local_1c8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  getShaderInitialization_abi_cxx11_
            (&local_1e8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"sampler","");
  NegativeTestShared::anon_unknown_0::declareShaderUniform(&local_208,shaderType,&local_228);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    ",4);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"P","");
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_248,samplerDataType,&local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_248._M_dataplus._M_p,local_248._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  uVar4 = shaderType - 0x42;
  if (uVar4 < 0x19) {
    if ((0x1c00007U >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x380000U >> (uVar4 & 0x1f) & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    texelFetch(sampler, P);\n",0x1c);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"varSample","");
      NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
                (&local_2a8,local_2ac,&local_288);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"    texelFetch(sampler, P, varSample);\n",0x27);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceTexelFetch (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType samplerDataType, glu::DataType pDataType, glu::DataType sampleDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderExtensionDeclaration(getDataTypeExtension(samplerDataType))
			<< getShaderInitialization(ctx, shaderType)
			<< declareShaderUniform(samplerDataType, "sampler")
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(pDataType, "P");

	switch (samplerDataType)
	{
		case glu::TYPE_SAMPLER_2D_MULTISAMPLE:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE:
		case glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY:
			source	<< "    " << declareAndInitializeShaderVariable(sampleDataType, "varSample")
					<< "    texelFetch(sampler, P, varSample);\n";
			break;

		case glu::TYPE_SAMPLER_BUFFER:
		case glu::TYPE_INT_SAMPLER_BUFFER:
		case glu::TYPE_UINT_SAMPLER_BUFFER:
			source << "    texelFetch(sampler, P);\n";
			break;

		default:
			DE_FATAL("Unsupported data type.");
	}

	source << "}\n";

	return source.str();
}